

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

void gauden_norm_wt_fullvar
               (vector_t ****in_var,vector_t ****wt_var,int32 pass2var,float32 ***dnom,
               vector_t ***mean,uint32 n_mgau,uint32 n_feat,uint32 n_density,uint32 *veclen,
               int32 tiedvar)

{
  uint uVar1;
  float *pfVar2;
  vector_t *ppfVar3;
  vector_t *ppfVar4;
  vector_t pfVar5;
  float32 *pfVar6;
  ulong uVar7;
  ulong uVar8;
  float32 **a;
  ulong uVar9;
  ulong uVar10;
  vector_t pfVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  
  uVar7 = (ulong)n_mgau;
  if (tiedvar != 0) {
    if (n_feat != 0) {
      uVar8 = 0;
      do {
        if ((pass2var == 0) && (uVar1 = veclen[uVar8], (ulong)uVar1 != 0)) {
          pfVar2 = (float *)(*dnom)[uVar8];
          pfVar11 = *(*mean)[uVar8];
          uVar10 = 0;
          do {
            pfVar11[uVar10] = *pfVar2 * pfVar11[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar1 != uVar10);
        }
        if (1 < n_density) {
          uVar10 = (ulong)veclen[uVar8];
          pfVar2 = (float *)(*dnom)[uVar8];
          uVar9 = 1;
          do {
            if (uVar10 != 0) {
              ppfVar3 = (*wt_var)[uVar8][uVar9];
              ppfVar4 = *(*wt_var)[uVar8];
              uVar12 = 0;
              do {
                pfVar11 = ppfVar3[uVar12];
                pfVar5 = ppfVar4[uVar12];
                uVar14 = 0;
                do {
                  pfVar5[uVar14] = pfVar11[uVar14] + pfVar5[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar10 != uVar14);
                if (pass2var == 0) {
                  pfVar11 = *(*mean)[uVar8];
                  pfVar11[uVar12] = (*mean)[uVar8][uVar9][uVar12] * pfVar2[uVar9] + pfVar11[uVar12];
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar10);
            }
            *pfVar2 = pfVar2[uVar9] + *pfVar2;
            uVar9 = uVar9 + 1;
          } while (uVar9 != n_density);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != n_feat);
    }
    if (1 < n_mgau) {
      uVar8 = 1;
      do {
        if (n_feat != 0) {
          uVar10 = 0;
          do {
            if (n_density != 0) {
              uVar9 = (ulong)veclen[uVar10];
              pfVar6 = dnom[uVar8][uVar10];
              pfVar2 = (float *)(*dnom)[uVar10];
              uVar12 = 0;
              do {
                if (uVar9 != 0) {
                  ppfVar3 = wt_var[uVar8][uVar10][uVar12];
                  ppfVar4 = *(*wt_var)[uVar10];
                  uVar14 = 0;
                  do {
                    pfVar11 = ppfVar3[uVar14];
                    pfVar5 = ppfVar4[uVar14];
                    uVar13 = 0;
                    do {
                      pfVar5[uVar13] = pfVar11[uVar13] + pfVar5[uVar13];
                      uVar13 = uVar13 + 1;
                    } while (uVar9 != uVar13);
                    if (pass2var == 0) {
                      (*(*mean)[uVar10])[uVar14] =
                           mean[uVar8][uVar10][uVar12][uVar14] * (float)pfVar6[uVar12] +
                           (*(*mean)[uVar10])[uVar14];
                    }
                    uVar14 = uVar14 + 1;
                  } while (uVar14 != uVar9);
                }
                *pfVar2 = (float)pfVar6[uVar12] + *pfVar2;
                uVar12 = uVar12 + 1;
              } while (uVar12 != n_density);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != n_feat);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar7);
    }
    if (n_mgau == 0) {
      return;
    }
    uVar8 = 0;
    do {
      if (n_feat != 0) {
        uVar10 = 0;
        do {
          if (n_density != 0) {
            uVar9 = (ulong)veclen[uVar10];
            pfVar2 = (float *)(*dnom)[uVar10];
            pfVar6 = dnom[uVar8][uVar10];
            uVar12 = 0;
            do {
              if (uVar9 != 0) {
                ppfVar3 = *(*wt_var)[uVar10];
                ppfVar4 = wt_var[uVar8][uVar10][uVar12];
                uVar14 = 0;
                do {
                  if (pass2var == 0) {
                    if ((int)uVar12 == 0 && (int)uVar8 == 0) {
                      pfVar11 = *(*mean)[uVar10];
                      fVar15 = pfVar11[uVar14] / *pfVar2;
                    }
                    else {
                      fVar15 = (*(*mean)[uVar10])[uVar14];
                      pfVar11 = mean[uVar8][uVar10][uVar12];
                    }
                    pfVar11[uVar14] = fVar15;
                  }
                  pfVar11 = ppfVar3[uVar14];
                  pfVar5 = ppfVar4[uVar14];
                  uVar13 = 0;
                  do {
                    pfVar5[uVar13] = pfVar11[uVar13];
                    uVar13 = uVar13 + 1;
                  } while (uVar9 != uVar13);
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar9);
              }
              pfVar6[uVar12] = (float32)*pfVar2;
              uVar12 = uVar12 + 1;
            } while (uVar12 != n_density);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != n_feat);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar7);
  }
  if (n_mgau != 0) {
    uVar8 = 0;
    do {
      if (n_feat != 0) {
        uVar10 = 0;
        do {
          if (pass2var == 0) {
            a = (float32 **)
                __ckd_calloc_2d__((ulong)veclen[uVar10],(ulong)veclen[uVar10],4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                  ,0x703);
          }
          else {
            a = (float32 **)0x0;
          }
          if (n_density != 0) {
            uVar9 = 0;
            do {
              if (pass2var == 0) {
                outerproduct(a,(float32 *)mean[uVar8][uVar10][uVar9],
                             (float32 *)mean[uVar8][uVar10][uVar9],veclen[uVar10]);
              }
              pfVar6 = dnom[uVar8][uVar10];
              if (((float)pfVar6[uVar9] != 0.0) || (NAN((float)pfVar6[uVar9]))) {
                uVar12 = (ulong)veclen[uVar10];
                if (uVar12 != 0) {
                  uVar14 = 0;
                  do {
                    uVar13 = 0;
                    do {
                      if (pass2var == 0) {
                        pfVar11 = wt_var[uVar8][uVar10][uVar9][uVar14];
                        fVar15 = pfVar11[uVar13] / (float)pfVar6[uVar9] - (float)a[uVar14][uVar13];
                      }
                      else {
                        pfVar11 = wt_var[uVar8][uVar10][uVar9][uVar14];
                        fVar15 = pfVar11[uVar13] / (float)pfVar6[uVar9];
                      }
                      pfVar11[uVar13] = fVar15;
                      uVar13 = uVar13 + 1;
                    } while (uVar12 != uVar13);
                    uVar14 = uVar14 + 1;
                  } while (uVar14 != uVar12);
                }
              }
              else if (in_var != (vector_t ****)0x0) {
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                        ,0x71b,"Copying unseen var (%u, %u, %u) from in_var\n",uVar8 & 0xffffffff,
                        uVar10 & 0xffffffff,(int)uVar9);
                uVar1 = veclen[uVar10];
                if ((ulong)uVar1 != 0) {
                  uVar12 = 0;
                  do {
                    wt_var[uVar8][uVar10][uVar9][uVar12] = in_var[uVar8][uVar10][uVar9][uVar12];
                    uVar12 = uVar12 + 1;
                  } while (uVar1 != uVar12);
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != n_density);
          }
          if (pass2var == 0) {
            ckd_free_2d(a);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != n_feat);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar7);
  }
  return;
}

Assistant:

void
gauden_norm_wt_fullvar(vector_t ****in_var,
		       vector_t ****wt_var,
		       int32 pass2var,
		       float32 ***dnom,
		       vector_t ***mean,
		       uint32 n_mgau,
		       uint32 n_feat,
		       uint32 n_density,
		       const uint32 *veclen,
		       int32 tiedvar)
{
    uint32 i, j, k, l, ll;

    if (tiedvar) {
	gauden_tie_fullvars_dnoms(wt_var, pass2var, dnom, mean,
				  n_mgau, n_feat, n_density, veclen);
    }
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    vector_t *outermean = NULL;
	    if (!pass2var)
		outermean = (vector_t *)ckd_calloc_2d(veclen[j], veclen[j], sizeof(float32));
		
	    for (k = 0; k < n_density; k++) {
		if (!pass2var)
		    outerproduct(outermean,
				 mean[i][j][k], mean[i][j][k],
				 veclen[j]);
		if (dnom[i][j][k] != 0) {
		    for (l = 0; l < veclen[j]; l++) {
			for (ll = 0; ll < veclen[j]; ll++) {
			    if (!pass2var) {
				wt_var[i][j][k][l][ll] =
				    (wt_var[i][j][k][l][ll] / dnom[i][j][k]) -
				    outermean[l][ll];
			    }
			    else {
				wt_var[i][j][k][l][ll] /= dnom[i][j][k];
			    }
			}
		    }
		}
		else {
		    if (in_var) {
			E_INFO("Copying unseen var (%u, %u, %u) from in_var\n",
			       i, j, k);
			for (l = 0; l < veclen[j]; l++) {
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			}
		    }
		}
	    }
	    if (!pass2var)
		ckd_free_2d((void **)outermean);
	}
    }
}